

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

aiMatrix4x4 * get_world_transform(aiMatrix4x4 *__return_storage_ptr__,aiNode *node,aiScene *scene)

{
  __normal_iterator<const_aiNode_**,_std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>_>
  __tmp;
  pointer ppaVar1;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> node_chain;
  aiNode *local_40;
  _Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_40 = node; local_40 != scene->mRootNode; local_40 = local_40->mParent) {
    std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::push_back
              ((vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)&local_38,&local_40);
  }
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  for (ppaVar1 = local_38._M_impl.super__Vector_impl_data._M_finish;
      ppaVar1 != local_38._M_impl.super__Vector_impl_data._M_start; ppaVar1 = ppaVar1 + -1) {
    aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,&ppaVar1[-1]->mTransformation);
  }
  std::_Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 get_world_transform(const aiNode* node, const aiScene* scene)
{
    std::vector<const aiNode*> node_chain;
    while (node != scene->mRootNode) {
        node_chain.push_back(node);
        node = node->mParent;
    }
    aiMatrix4x4 transform;
    for (auto n = node_chain.rbegin(); n != node_chain.rend(); ++n) {
        transform *= (*n)->mTransformation;
    }
    return transform;
}